

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void report_biggest_periods
               (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *repeats,string *sequence,
               size_t max,int min_size)

{
  unsigned_long *puVar1;
  iterator iVar2;
  ostream *poVar3;
  long local_88;
  Repeat *local_80;
  Repeat *local_78;
  Repeat *local_70;
  Repeat *local_60;
  Repeat *local_58;
  Repeat *local_50;
  Repeat *local_48;
  __normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
  local_40;
  __normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
  nth;
  ulong local_30;
  unsigned_long n;
  size_t sStack_20;
  int min_size_local;
  size_t max_local;
  string *sequence_local;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *repeats_local;
  
  sStack_20 = max;
  max_local = (size_t)sequence;
  sequence_local = (string *)repeats;
  nth._M_current =
       (Repeat *)std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::size(repeats);
  puVar1 = std::min<unsigned_long>(&stack0xffffffffffffffe0,(unsigned_long *)&nth);
  local_30 = *puVar1;
  local_48 = (Repeat *)
             std::begin<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                       ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)sequence_local);
  local_40 = std::
             next<__gnu_cxx::__normal_iterator<tandem::Repeat*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>>
                       ((__normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                         )local_48,local_30);
  local_50 = (Repeat *)
             std::begin<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                       ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)sequence_local);
  local_58 = local_40._M_current;
  local_60 = (Repeat *)
             std::end<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                       ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)sequence_local);
  std::
  partial_sort<__gnu_cxx::__normal_iterator<tandem::Repeat*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>,PeriodGreater>
            (local_50,local_58,local_60);
  if (0 < min_size) {
    local_78 = (Repeat *)
               std::begin<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                         ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)sequence_local)
    ;
    local_80 = local_40._M_current;
    local_88 = (long)min_size;
    local_70 = (Repeat *)
               std::
               lower_bound<__gnu_cxx::__normal_iterator<tandem::Repeat*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>,unsigned_long,PeriodGreater>
                         (local_78,local_40._M_current,&local_88);
    local_40 = (__normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                )local_70;
    iVar2 = std::begin<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                      ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)sequence_local);
    local_30 = std::
               distance<__gnu_cxx::__normal_iterator<tandem::Repeat*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>>
                         ((__normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                           )iVar2._M_current,local_40);
  }
  poVar3 = std::operator<<((ostream *)&std::clog,"Printing the ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3," repeats with the largest periods");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar2 = std::begin<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                    ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)sequence_local);
  print((RepeatIterator)iVar2._M_current,(RepeatIterator)local_40._M_current,(string *)max_local);
  return;
}

Assistant:

void report_biggest_periods(std::vector<tandem::Repeat>& repeats, const std::string& sequence,
                            const std::size_t max, const int min_size = -1)
{
    auto n = std::min(max, repeats.size());
    auto nth = std::next(std::begin(repeats), n);
    std::partial_sort(std::begin(repeats), nth, std::end(repeats), PeriodGreater {});
    if (min_size > 0) {
        nth = std::lower_bound(std::begin(repeats), nth, static_cast<std::size_t>(min_size), PeriodGreater {});
        n = std::distance(std::begin(repeats), nth);
    }
    std::clog << "Printing the " << n << " repeats with the largest periods" << std::endl;
    print(std::begin(repeats), nth, sequence);
}